

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall Search::action_repr::action_repr(action_repr *this,action _a,features *_repr)

{
  features *this_00;
  
  this->a = _a;
  if (_repr != (features *)0x0) {
    this_00 = (features *)operator_new(0x68);
    (this_00->values)._begin = (float *)0x0;
    (this_00->values)._end = (float *)0x0;
    (this_00->values).end_array = (float *)0x0;
    (this_00->values).erase_count = 0;
    (this_00->indicies)._begin = (unsigned_long *)0x0;
    (this_00->indicies)._end = (unsigned_long *)0x0;
    (this_00->indicies).end_array = (unsigned_long *)0x0;
    (this_00->indicies).erase_count = 0;
    (this_00->space_names)._begin =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (this_00->space_names)._end =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    this_00->sum_feat_sq = 0.0;
    (this_00->space_names).end_array =
         (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (this_00->space_names).erase_count = 0;
    this->repr = this_00;
    features::deep_copy_from(this_00,_repr);
    return;
  }
  this->repr = (features *)0x0;
  return;
}

Assistant:

action_repr(action _a, features* _repr) : a(_a)
  {
    if (_repr != nullptr)
    {
      repr = new features();
      repr->deep_copy_from(*_repr);
    }
    else
      repr = nullptr;
  }